

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inftrees.c
# Opt level: O3

int inflate_table(codetype type,unsigned_short *lens,uint codes,code **table,uint *bits,
                 unsigned_short *work)

{
  ushort *puVar1;
  code *pcVar2;
  byte bVar3;
  uchar uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  byte bVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  code *pcVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  bool bVar26;
  uint local_c0;
  uint local_bc;
  unsigned_short *local_a0;
  unsigned_short *local_98;
  ushort local_88 [20];
  uint *local_60;
  ushort auStack_58 [12];
  unsigned_short count [16];
  
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  if (codes != 0) {
    uVar15 = 0;
    do {
      local_88[lens[uVar15]] = local_88[lens[uVar15]] + 1;
      uVar15 = uVar15 + 1;
    } while (codes != uVar15);
  }
  uVar15 = 0xf;
  while (uVar18 = (uint)uVar15, local_88[uVar15] == 0) {
    uVar15 = (ulong)(uVar18 - 1);
    if (uVar18 - 1 == 0) {
      pcVar21 = *table;
      *table = pcVar21 + 1;
      pcVar21->op = '@';
      pcVar21->bits = '\x01';
      pcVar21->val = 0;
      pcVar21 = *table;
      *table = pcVar21 + 1;
      pcVar21->op = '@';
      pcVar21->bits = '\x01';
      pcVar21->val = 0;
      uVar25 = 1;
LAB_0011b303:
      *bits = uVar25;
      return 0;
    }
  }
  uVar25 = *bits;
  if (uVar18 <= *bits) {
    uVar25 = uVar18;
  }
  iVar11 = 1;
  uVar24 = 1;
  if (1 < uVar18) {
    uVar23 = 1;
    do {
      uVar24 = uVar23;
      if (local_88[uVar23] != 0) break;
      uVar23 = uVar23 + 1;
      uVar24 = uVar15;
    } while (uVar15 != uVar23);
  }
  uVar15 = (ulong)uVar25;
  if (uVar25 <= (uint)uVar24) {
    uVar15 = uVar24 & 0xffffffff;
  }
  lVar22 = 1;
  do {
    iVar11 = iVar11 * 2 - (uint)local_88[lVar22];
    if (iVar11 < 0) {
      return -1;
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x10);
  local_60 = bits;
  if ((iVar11 != 0) && (uVar18 != 1 || type == CODES)) {
    return -1;
  }
  auStack_58[1] = 0;
  lVar22 = 0;
  uVar10 = 0;
  do {
    uVar10 = uVar10 + local_88[lVar22 + 1];
    auStack_58[lVar22 + 2] = uVar10;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0xe);
  if (codes != 0) {
    uVar23 = 0;
    do {
      uVar17 = (ulong)lens[uVar23];
      if (uVar17 != 0) {
        uVar10 = auStack_58[uVar17];
        auStack_58[uVar17] = uVar10 + 1;
        work[uVar10] = (unsigned_short)uVar23;
      }
      uVar23 = uVar23 + 1;
    } while (codes != uVar23);
  }
  uVar25 = (uint)uVar15;
  if (type == CODES) {
    local_c0 = 0x14;
    bVar26 = false;
    local_a0 = work;
    local_98 = work;
  }
  else {
    if (type == LENS) {
      if (9 < uVar25) {
        return 1;
      }
      bVar3 = 1;
      local_c0 = 0x101;
      local_98 = inflate_table::lext;
      local_a0 = inflate_table::lbase;
      bVar26 = false;
      goto LAB_0011b451;
    }
    local_c0 = 0;
    local_98 = inflate_table::dext;
    local_a0 = inflate_table::dbase;
    bVar26 = type == DISTS;
    if (bVar26) {
      bVar3 = 0;
      if (9 < uVar25) {
        return 1;
      }
      goto LAB_0011b451;
    }
  }
  bVar3 = 0;
LAB_0011b451:
  bVar8 = (byte)uVar15;
  uVar5 = 1 << (bVar8 & 0x1f);
  uVar6 = uVar5 - 1;
  pcVar21 = *table;
  local_bc = 0xffffffff;
  uVar23 = 0;
  uVar20 = 0;
  uVar13 = 0;
  do {
    uVar19 = 1 << ((byte)uVar15 & 0x1f);
    do {
      uVar10 = work[uVar23];
      if (uVar10 + 1 < local_c0) {
        uVar4 = '\0';
      }
      else {
        uVar12 = uVar10 - local_c0;
        if (uVar10 < local_c0) {
          uVar4 = '`';
          uVar10 = 0;
        }
        else {
          uVar4 = (uchar)local_98[uVar12];
          uVar10 = local_a0[uVar12];
        }
      }
      bVar9 = (char)uVar24 - (byte)uVar20;
      iVar11 = -1 << (bVar9 & 0x1f);
      uVar12 = uVar19;
      do {
        uVar16 = (uVar13 >> ((byte)uVar20 & 0x1f)) + iVar11 + uVar12;
        pcVar21[uVar16].op = uVar4;
        pcVar21[uVar16].bits = bVar9;
        pcVar21[uVar16].val = uVar10;
        uVar12 = uVar12 + iVar11;
      } while (uVar12 != 0);
      uVar12 = 1 << ((char)uVar24 - 1U & 0x1f);
      do {
        uVar16 = uVar12;
        uVar12 = uVar16 >> 1;
      } while ((uVar16 & uVar13) != 0);
      uVar13 = (uVar16 - 1 & uVar13) + uVar16;
      if (uVar16 == 0) {
        uVar13 = 0;
      }
      uVar23 = (ulong)((int)uVar23 + 1);
      puVar1 = local_88 + (uVar24 & 0xffffffff);
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        if ((uint)uVar24 == uVar18) {
          if (uVar13 != 0) {
            pcVar21[uVar13].op = '@';
            pcVar21[uVar13].bits = bVar9;
            pcVar21[uVar13].val = 0;
          }
          *table = *table + uVar5;
          bits = local_60;
          goto LAB_0011b303;
        }
        uVar24 = (ulong)lens[work[uVar23]];
      }
      uVar12 = (uint)uVar24;
    } while ((uVar12 <= uVar25) || (uVar16 = uVar13 & uVar6, uVar16 == local_bc));
    if (uVar20 == 0) {
      uVar20 = uVar25;
    }
    uVar14 = uVar12 - uVar20;
    iVar11 = 1 << ((byte)uVar14 & 0x1f);
    if (uVar12 < uVar18) {
      uVar14 = uVar18 - uVar20;
      uVar15 = uVar24 & 0xffffffff;
      do {
        iVar7 = iVar11 - (uint)local_88[uVar15];
        if (iVar7 == 0 || iVar11 < (int)(uint)local_88[uVar15]) {
          uVar14 = (int)uVar15 - uVar20;
          break;
        }
        iVar11 = iVar7 * 2;
        uVar12 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar12;
      } while (uVar12 < uVar18);
      iVar11 = 1 << ((byte)uVar14 & 0x1f);
    }
    uVar15 = (ulong)uVar14;
    uVar5 = uVar5 + iVar11;
    if ((bool)(bVar3 & 0x354 < uVar5)) {
      return 1;
    }
    if ((bool)(0x250 < uVar5 & bVar26)) {
      return 1;
    }
    pcVar21 = pcVar21 + uVar19;
    pcVar2 = *table;
    pcVar2[uVar16].op = (uchar)uVar14;
    pcVar2[uVar16].bits = bVar8;
    pcVar2[uVar16].val = (unsigned_short)((uint)((int)pcVar21 - (int)pcVar2) >> 2);
    local_bc = uVar16;
  } while( true );
}

Assistant:

int ZLIB_INTERNAL inflate_table(type, lens, codes, table, bits, work)
codetype type;
unsigned short FAR *lens;
unsigned codes;
code FAR * FAR *table;
unsigned FAR *bits;
unsigned short FAR *work;
{
    unsigned len;               /* a code's length in bits */
    unsigned sym;               /* index of code symbols */
    unsigned min, max;          /* minimum and maximum code lengths */
    unsigned root;              /* number of index bits for root table */
    unsigned curr;              /* number of index bits for current table */
    unsigned drop;              /* code bits to drop for sub-table */
    int left;                   /* number of prefix codes available */
    unsigned used;              /* code entries in table used */
    unsigned huff;              /* Huffman code */
    unsigned incr;              /* for incrementing code, index */
    unsigned fill;              /* index for replicating entries */
    unsigned low;               /* low bits for current root entry */
    unsigned mask;              /* mask for low root bits */
    code here;                  /* table entry for duplication */
    code FAR *next;             /* next available space in table */
    const unsigned short FAR *base;     /* base value table to use */
    const unsigned short FAR *extra;    /* extra bits table to use */
    unsigned match;             /* use base and extra for symbol >= match */
    unsigned short count[MAXBITS+1];    /* number of codes of each length */
    unsigned short offs[MAXBITS+1];     /* offsets in table for each length */
    static const unsigned short lbase[31] = { /* Length codes 257..285 base */
        3, 4, 5, 6, 7, 8, 9, 10, 11, 13, 15, 17, 19, 23, 27, 31,
        35, 43, 51, 59, 67, 83, 99, 115, 131, 163, 195, 227, 258, 0, 0};
    static const unsigned short lext[31] = { /* Length codes 257..285 extra */
        16, 16, 16, 16, 16, 16, 16, 16, 17, 17, 17, 17, 18, 18, 18, 18,
        19, 19, 19, 19, 20, 20, 20, 20, 21, 21, 21, 21, 16, 77, 202};
    static const unsigned short dbase[32] = { /* Distance codes 0..29 base */
        1, 2, 3, 4, 5, 7, 9, 13, 17, 25, 33, 49, 65, 97, 129, 193,
        257, 385, 513, 769, 1025, 1537, 2049, 3073, 4097, 6145,
        8193, 12289, 16385, 24577, 0, 0};
    static const unsigned short dext[32] = { /* Distance codes 0..29 extra */
        16, 16, 16, 16, 17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22,
        23, 23, 24, 24, 25, 25, 26, 26, 27, 27,
        28, 28, 29, 29, 64, 64};

    /*
       Process a set of code lengths to create a canonical Huffman code.  The
       code lengths are lens[0..codes-1].  Each length corresponds to the
       symbols 0..codes-1.  The Huffman code is generated by first sorting the
       symbols by length from short to long, and retaining the symbol order
       for codes with equal lengths.  Then the code starts with all zero bits
       for the first code of the shortest length, and the codes are integer
       increments for the same length, and zeros are appended as the length
       increases.  For the deflate format, these bits are stored backwards
       from their more natural integer increment ordering, and so when the
       decoding tables are built in the large loop below, the integer codes
       are incremented backwards.

       This routine assumes, but does not check, that all of the entries in
       lens[] are in the range 0..MAXBITS.  The caller must assure this.
       1..MAXBITS is interpreted as that code length.  zero means that that
       symbol does not occur in this code.

       The codes are sorted by computing a count of codes for each length,
       creating from that a table of starting indices for each length in the
       sorted table, and then entering the symbols in order in the sorted
       table.  The sorted table is work[], with that space being provided by
       the caller.

       The length counts are used for other purposes as well, i.e. finding
       the minimum and maximum length codes, determining if there are any
       codes at all, checking for a valid set of lengths, and looking ahead
       at length counts to determine sub-table sizes when building the
       decoding tables.
     */

    /* accumulate lengths for codes (assumes lens[] all in 0..MAXBITS) */
    for (len = 0; len <= MAXBITS; len++)
        count[len] = 0;
    for (sym = 0; sym < codes; sym++)
        count[lens[sym]]++;

    /* bound code lengths, force root to be within code lengths */
    root = *bits;
    for (max = MAXBITS; max >= 1; max--)
        if (count[max] != 0) break;
    if (root > max) root = max;
    if (max == 0) {                     /* no symbols to code at all */
        here.op = (unsigned char)64;    /* invalid code marker */
        here.bits = (unsigned char)1;
        here.val = (unsigned short)0;
        *(*table)++ = here;             /* make a table to force an error */
        *(*table)++ = here;
        *bits = 1;
        return 0;     /* no symbols, but wait for decoding to report error */
    }
    for (min = 1; min < max; min++)
        if (count[min] != 0) break;
    if (root < min) root = min;

    /* check for an over-subscribed or incomplete set of lengths */
    left = 1;
    for (len = 1; len <= MAXBITS; len++) {
        left <<= 1;
        left -= count[len];
        if (left < 0) return -1;        /* over-subscribed */
    }
    if (left > 0 && (type == CODES || max != 1))
        return -1;                      /* incomplete set */

    /* generate offsets into symbol table for each length for sorting */
    offs[1] = 0;
    for (len = 1; len < MAXBITS; len++)
        offs[len + 1] = offs[len] + count[len];

    /* sort symbols by length, by symbol order within each length */
    for (sym = 0; sym < codes; sym++)
        if (lens[sym] != 0) work[offs[lens[sym]]++] = (unsigned short)sym;

    /*
       Create and fill in decoding tables.  In this loop, the table being
       filled is at next and has curr index bits.  The code being used is huff
       with length len.  That code is converted to an index by dropping drop
       bits off of the bottom.  For codes where len is less than drop + curr,
       those top drop + curr - len bits are incremented through all values to
       fill the table with replicated entries.

       root is the number of index bits for the root table.  When len exceeds
       root, sub-tables are created pointed to by the root entry with an index
       of the low root bits of huff.  This is saved in low to check for when a
       new sub-table should be started.  drop is zero when the root table is
       being filled, and drop is root when sub-tables are being filled.

       When a new sub-table is needed, it is necessary to look ahead in the
       code lengths to determine what size sub-table is needed.  The length
       counts are used for this, and so count[] is decremented as codes are
       entered in the tables.

       used keeps track of how many table entries have been allocated from the
       provided *table space.  It is checked for LENS and DIST tables against
       the constants ENOUGH_LENS and ENOUGH_DISTS to guard against changes in
       the initial root table size constants.  See the comments in inftrees.h
       for more information.

       sym increments through all symbols, and the loop terminates when
       all codes of length max, i.e. all codes, have been processed.  This
       routine permits incomplete codes, so another loop after this one fills
       in the rest of the decoding tables with invalid code markers.
     */

    /* set up for code type */
    switch (type) {
    case CODES:
        base = extra = work;    /* dummy value--not used */
        match = 20;
        break;
    case LENS:
        base = lbase;
        extra = lext;
        match = 257;
        break;
    default:    /* DISTS */
        base = dbase;
        extra = dext;
        match = 0;
    }

    /* initialize state for loop */
    huff = 0;                   /* starting code */
    sym = 0;                    /* starting code symbol */
    len = min;                  /* starting code length */
    next = *table;              /* current table to fill in */
    curr = root;                /* current table index bits */
    drop = 0;                   /* current bits to drop from code for index */
    low = (unsigned)(-1);       /* trigger new sub-table when len > root */
    used = 1U << root;          /* use root table entries */
    mask = used - 1;            /* mask for comparing low */

    /* check available table space */
    if ((type == LENS && used > ENOUGH_LENS) ||
        (type == DISTS && used > ENOUGH_DISTS))
        return 1;

    /* process all codes and make table entries */
    for (;;) {
        /* create table entry */
        here.bits = (unsigned char)(len - drop);
        if (work[sym] + 1U < match) {
            here.op = (unsigned char)0;
            here.val = work[sym];
        }
        else if (work[sym] >= match) {
            here.op = (unsigned char)(extra[work[sym] - match]);
            here.val = base[work[sym] - match];
        }
        else {
            here.op = (unsigned char)(32 + 64);         /* end of block */
            here.val = 0;
        }

        /* replicate for those indices with low len bits equal to huff */
        incr = 1U << (len - drop);
        fill = 1U << curr;
        min = fill;                 /* save offset to next table */
        do {
            fill -= incr;
            next[(huff >> drop) + fill] = here;
        } while (fill != 0);

        /* backwards increment the len-bit code huff */
        incr = 1U << (len - 1);
        while (huff & incr)
            incr >>= 1;
        if (incr != 0) {
            huff &= incr - 1;
            huff += incr;
        }
        else
            huff = 0;

        /* go to next symbol, update count, len */
        sym++;
        if (--(count[len]) == 0) {
            if (len == max) break;
            len = lens[work[sym]];
        }

        /* create new sub-table if needed */
        if (len > root && (huff & mask) != low) {
            /* if first time, transition to sub-tables */
            if (drop == 0)
                drop = root;

            /* increment past last table */
            next += min;            /* here min is 1 << curr */

            /* determine length of next table */
            curr = len - drop;
            left = (int)(1 << curr);
            while (curr + drop < max) {
                left -= count[curr + drop];
                if (left <= 0) break;
                curr++;
                left <<= 1;
            }

            /* check for enough space */
            used += 1U << curr;
            if ((type == LENS && used > ENOUGH_LENS) ||
                (type == DISTS && used > ENOUGH_DISTS))
                return 1;

            /* point entry in root table to sub-table */
            low = huff & mask;
            (*table)[low].op = (unsigned char)curr;
            (*table)[low].bits = (unsigned char)root;
            (*table)[low].val = (unsigned short)(next - *table);
        }
    }

    /* fill in remaining table entry if code is incomplete (guaranteed to have
       at most one remaining entry, since if the code is incomplete, the
       maximum code length that was allowed to get this far is one bit) */
    if (huff != 0) {
        here.op = (unsigned char)64;            /* invalid code marker */
        here.bits = (unsigned char)(len - drop);
        here.val = (unsigned short)0;
        next[huff] = here;
    }

    /* set return parameters */
    *table += used;
    *bits = root;
    return 0;
}